

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O2

void __thiscall dmlc::JSONWriter::EndArray(JSONWriter *this)

{
  pointer *ppuVar1;
  ulong uVar2;
  unsigned_long uVar3;
  ostream *poVar4;
  reference rVar5;
  LogCheckError _check_err;
  uint local_1b4;
  LogMessageFatal local_1b0;
  
  local_1b0._0_8_ =
       (ulong)(this->scope_multi_line_).super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
       ((long)(this->scope_multi_line_).super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
       (long)(this->scope_multi_line_).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8;
  local_1b4 = 0;
  LogCheck_NE<unsigned_long,unsigned_int>
            ((dmlc *)&_check_err,(unsigned_long *)&local_1b0,&local_1b4);
  if (_check_err.str != (string *)0x0) {
    LogMessageFatal::LogMessageFatal
              (&local_1b0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/3rdparty/dmlc-core/include/dmlc/json.h"
               ,0x371);
    poVar4 = std::operator<<((ostream *)&local_1b0,"Check failed: ");
    poVar4 = std::operator<<(poVar4,"scope_multi_line_.size() != 0U");
    poVar4 = std::operator<<(poVar4,(string *)_check_err.str);
    std::operator<<(poVar4,": ");
    LogMessageFatal::~LogMessageFatal(&local_1b0);
  }
  LogCheckError::~LogCheckError(&_check_err);
  local_1b0._0_8_ =
       (long)(this->scope_counter_).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(this->scope_counter_).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start >> 3;
  local_1b4 = 0;
  LogCheck_NE<unsigned_long,unsigned_int>
            ((dmlc *)&_check_err,(unsigned_long *)&local_1b0,&local_1b4);
  if (_check_err.str != (string *)0x0) {
    LogMessageFatal::LogMessageFatal
              (&local_1b0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/3rdparty/dmlc-core/include/dmlc/json.h"
               ,0x372);
    poVar4 = std::operator<<((ostream *)&local_1b0,"Check failed: ");
    poVar4 = std::operator<<(poVar4,"scope_counter_.size() != 0U");
    poVar4 = std::operator<<(poVar4,(string *)_check_err.str);
    std::operator<<(poVar4,": ");
    LogMessageFatal::~LogMessageFatal(&local_1b0);
  }
  LogCheckError::~LogCheckError(&_check_err);
  rVar5 = std::vector<bool,_std::allocator<bool>_>::back(&this->scope_multi_line_);
  uVar2 = *rVar5._M_p;
  uVar3 = (this->scope_counter_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_finish[-1];
  std::_Bit_iterator_base::_M_bump_down
            (&(this->scope_multi_line_).super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_finish.super__Bit_iterator_base);
  ppuVar1 = &(this->scope_counter_).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
  *ppuVar1 = *ppuVar1 + -1;
  if (((uVar2 & rVar5._M_mask) != 0) && (uVar3 != 0)) {
    WriteSeperator(this);
  }
  std::operator<<(this->os_,']');
  return;
}

Assistant:

inline void JSONWriter::EndArray() {
  CHECK_NE(scope_multi_line_.size(), 0U);
  CHECK_NE(scope_counter_.size(), 0U);
  bool newline = scope_multi_line_.back();
  size_t nelem = scope_counter_.back();
  scope_multi_line_.pop_back();
  scope_counter_.pop_back();
  if (newline && nelem != 0)
    WriteSeperator();
  Extend(os_, ']');
}